

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

Vec_Ptr_t * Amap_LibSelectGates(Amap_Lib_t *p,int fVerbose)

{
  int iVar1;
  Amap_Gat_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  void **__ptr;
  int i;
  Amap_Lib_t *pAVar6;
  int iVar7;
  uint uVar8;
  
  i = 0;
  pAVar2 = Amap_LibFindGate(p,0);
  p->pGate0 = pAVar2;
  pAVar2 = Amap_LibFindGate(p,0xffffffff);
  p->pGate1 = pAVar2;
  pAVar2 = Amap_LibFindGate(p,0xaaaaaaaa);
  p->pGateBuf = pAVar2;
  pAVar6 = p;
  pAVar2 = Amap_LibFindGate(p,0x55555555);
  p->pGateInv = pAVar2;
  pVVar3 = Vec_PtrAlloc((int)pAVar6);
  do {
    if (p->vSorted->nSize <= i) {
      return pVVar3;
    }
    pvVar4 = Vec_PtrEntry(p->vSorted,i);
    if ((*(long *)((long)pvVar4 + 0x30) != 0) && (*(long *)((long)pvVar4 + 8) == 0)) {
      for (iVar7 = 0; i != iVar7; iVar7 = iVar7 + 1) {
        pvVar5 = Vec_PtrEntry(p->vSorted,iVar7);
        if ((*(void **)((long)pvVar5 + 0x30) != (void *)0x0) && (*(long *)((long)pvVar5 + 8) == 0))
        {
          if (*(uint *)((long)pvVar5 + 0x38) >> 0x18 == *(uint *)((long)pvVar4 + 0x38) >> 0x18) {
            iVar1 = 1 << ((char)(*(uint *)((long)pvVar5 + 0x38) >> 0x18) - 5U & 0x1f);
            if (*(uint *)((long)pvVar4 + 0x38) < 0x6000000) {
              iVar1 = 1;
            }
            iVar1 = bcmp(*(void **)((long)pvVar5 + 0x30),*(void **)((long)pvVar4 + 0x30),
                         (long)iVar1 << 2);
            if (iVar1 == 0) goto LAB_003a0454;
          }
        }
      }
      iVar7 = pVVar3->nSize;
      if (iVar7 == pVVar3->nCap) {
        uVar8 = iVar7 * 2;
        if (iVar7 < 0x10) {
          uVar8 = 0x10;
        }
        __ptr = pVVar3->pArray;
        if (iVar7 < (int)uVar8) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar8 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar8 << 3);
          }
          pVVar3->pArray = __ptr;
          pVVar3->nCap = uVar8;
        }
      }
      else {
        __ptr = pVVar3->pArray;
      }
      pVVar3->nSize = iVar7 + 1;
      __ptr[iVar7] = pvVar4;
    }
LAB_003a0454:
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Amap_LibSelectGates( Amap_Lib_t * p, int fVerbose )
{
    Vec_Ptr_t * vSelect;
    Amap_Gat_t * pGate, * pGate2;
    int i, k;//, clk = Abc_Clock();
    p->pGate0   = Amap_LibFindGate( p, 0 );
    p->pGate1   = Amap_LibFindGate( p, ~0 );
    p->pGateBuf = Amap_LibFindGate( p, 0xAAAAAAAA );
    p->pGateInv = Amap_LibFindGate( p, ~0xAAAAAAAA );
    vSelect = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if ( pGate->pFunc == NULL || pGate->pTwin != NULL )
            continue;
        Vec_PtrForEachEntryStop( Amap_Gat_t *, p->vSorted, pGate2, k, i )
        {
            if ( pGate2->pFunc == NULL || pGate2->pTwin != NULL )
                continue;
            if ( pGate2->nPins != pGate->nPins )
                continue;
            if ( !memcmp( pGate2->pFunc, pGate->pFunc, sizeof(unsigned) * Abc_TruthWordNum(pGate->nPins) ) )
                break;
        }
        if ( k < i )
            continue;
        Vec_PtrPush( vSelect, pGate );            
    }
    return vSelect;
}